

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_test.cpp
# Opt level: O0

void __thiscall Half_Randoms_Test::Half_Randoms_Test(Half_Randoms_Test *this)

{
  undefined8 *in_RDI;
  Test *unaff_retaddr;
  
  testing::Test::Test(unaff_retaddr);
  *in_RDI = &PTR__Half_Randoms_Test_03741e38;
  return;
}

Assistant:

TEST(Half, Randoms) {
    RNG rng;
    // Choose a bunch of random positive floats and make sure that they
    // convert to reasonable values.
    for (int i = 0; i < 1024; ++i) {
        float f = rng.Uniform<Float>() * 512;
        uint16_t h = Half(f).Bits();
        float fh = Float(Half::FromBits(h));
        if (fh == f) {
            // Very unlikely, but we happened to pick a value exactly
            // representable as a half.
            continue;
        } else {
            // The other half value that brackets the float.
            uint16_t hother;
            if (fh > f) {
                // The closest half was a bit bigger; therefore, the half before
                // it s the other one.
                hother = h - 1;
                if (hother > h) {
                    // test for wrapping around zero
                    continue;
                }
            } else {
                hother = h + 1;
                if (hother < h) {
                    // test for wrapping around zero
                    continue;
                }
            }

            // Make sure the two half values bracket the float.
            float fother = Float(Half::FromBits(hother));
            float dh = std::abs(fh - f);
            float dother = std::abs(fother - f);
            if (fh > f)
                EXPECT_LT(fother, f);
            else
                EXPECT_GT(fother, f);

            // Make sure rounding to the other one of them wouldn't have given a
            // closer half.
            EXPECT_LE(dh, dother);
        }
    }
}